

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.h
# Opt level: O2

void __thiscall crnlib::qdxt1::cluster_id::set(cluster_id *this,vector<unsigned_int> *indices)

{
  uint *puVar1;
  uint *puVar2;
  uint32 uVar3;
  uint i;
  ulong uVar4;
  
  vector<unsigned_int>::resize(&this->m_cells,indices->m_size,false);
  puVar1 = indices->m_p;
  puVar2 = (this->m_cells).m_p;
  for (uVar4 = 0; uVar4 < indices->m_size; uVar4 = uVar4 + 1) {
    puVar2[uVar4] = puVar1[uVar4];
  }
  std::__sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
            (puVar2,puVar2 + (this->m_cells).m_size);
  uVar3 = fast_hash((this->m_cells).m_p,(this->m_cells).m_size << 2);
  this->m_hash = (ulong)uVar3;
  return;
}

Assistant:

void set(const crnlib::vector<uint>& indices)
            {
                m_cells.resize(indices.size());

                for (uint i = 0; i < indices.size(); i++)
                {
                    m_cells[i] = static_cast<uint32>(indices[i]);
                }

                std::sort(m_cells.begin(), m_cells.end());

                m_hash = fast_hash(&m_cells[0], sizeof(m_cells[0]) * m_cells.size());
            }